

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  byte bVar1;
  Descriptor *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  MessageLite *pMVar5;
  MessageLite *extraout_RAX;
  char *description;
  OneofDescriptor *pOVar6;
  Arena *pAVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar2 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar8.descriptor,field,"MutableMessage");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_00f63a5b:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"MutableMessage",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    if ((bVar1 & 0x20) != 0) {
      description = "Field is repeated; the method requires a singular field.";
      goto LAB_00f63a5b;
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
      anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,field,"MutableMessage",CPPTYPE_MESSAGE);
    }
    if ((bVar1 & 8) != 0) {
      if (factory == (MessageFactory *)0x0) {
        factory = this->message_factory_;
      }
      uVar4 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      pMVar5 = protobuf::internal::ExtensionSet::MutableMessage
                         ((ExtensionSet *)
                          ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                          field,factory);
      return (Message *)pMVar5;
    }
    VerifyFieldType<google::protobuf::Message*>(this,field);
    factory = (MessageFactory *)MutableRawImpl(this,message,field);
    bVar3 = protobuf::internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar3) {
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar6 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar6 = (field->scope_).containing_oneof;
        if (pOVar6 == (OneofDescriptor *)0x0) goto LAB_00f63a77;
      }
      uVar4 = GetOneofCase(this,message,pOVar6);
      if (uVar4 == field->number_) goto LAB_00f6396a;
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar6 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar6 = (field->scope_).containing_oneof;
        if (pOVar6 == (OneofDescriptor *)0x0) {
LAB_00f63a77:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
      }
      ClearOneof(this,message,pOVar6);
      factory = (MessageFactory *)MutableField<google::protobuf::Message*>(this,message,field);
      pMVar5 = &GetDefaultMessageInstance(this,field)->super_MessageLite;
      pAVar7 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      pMVar5 = MessageLite::New(pMVar5,pAVar7);
      factory->_vptr_MessageFactory = (_func_int **)pMVar5;
    }
    else {
      SetHasBit(this,message,field);
LAB_00f6396a:
      pMVar5 = (MessageLite *)factory->_vptr_MessageFactory;
    }
    if (pMVar5 != (MessageLite *)0x0) {
      return (Message *)pMVar5;
    }
    pMVar5 = &GetDefaultMessageInstance(this,field)->super_MessageLite;
    pAVar7 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar7 & 1) == 0) goto LAB_00f639de;
  }
  else {
    pAVar7 = (Arena *)0x0;
    MutableMessage();
    pMVar5 = extraout_RAX;
  }
  pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
LAB_00f639de:
  pMVar5 = MessageLite::New(pMVar5,pAVar7);
  factory->_vptr_MessageFactory = (_func_int **)pMVar5;
  return (Message *)pMVar5;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = GetDefaultMessageInstance(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetHasBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = GetDefaultMessageInstance(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}